

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner.cc
# Opt level: O2

void __thiscall AwsCommandRunner::CopyFile(AwsCommandRunner *this,string *path)

{
  MultipleCommandRunner *pMVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator local_105;
  allocator local_104;
  allocator local_103;
  allocator local_102;
  allocator_type local_101;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  string full_url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  GetFullUrl(&full_url,this,path);
  pMVar1 = this->command_runner_;
  std::__cxx11::string::string((string *)&local_c8,"aws",&local_102);
  std::__cxx11::string::string(local_a8,"s3",&local_103);
  std::__cxx11::string::string(local_88,"rm",&local_104);
  std::__cxx11::string::string(local_68,"--recursive",&local_105);
  std::__cxx11::string::string(local_48,(string *)&full_url);
  __l._M_len = 5;
  __l._M_array = &local_c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_100,__l,&local_101);
  MultipleCommandRunner::RunCommand(pMVar1,&local_100,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100);
  lVar2 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c8._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  pMVar1 = this->command_runner_;
  std::__cxx11::string::string((string *)&local_c8,"aws",&local_102);
  std::__cxx11::string::string(local_a8,"s3",&local_103);
  std::__cxx11::string::string(local_88,"cp",&local_104);
  std::__cxx11::string::string(local_68,(string *)path);
  std::__cxx11::string::string(local_48,(string *)&full_url);
  __l_00._M_len = 5;
  __l_00._M_array = &local_c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_100,__l_00,(allocator_type *)&local_105);
  MultipleCommandRunner::RunCommand(pMVar1,&local_100,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100);
  lVar2 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c8._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)&full_url);
  return;
}

Assistant:

void AwsCommandRunner::CopyFile(const std::string& path) {
  std::string full_url = GetFullUrl(path);
  command_runner_->RunCommand({"aws", "s3", "rm", "--recursive", full_url},
                              false);
  command_runner_->RunCommand({"aws", "s3", "cp", path, full_url}, false);
}